

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,vector<double,_std::allocator<double>_> *coefficients)

{
  pointer pdVar1;
  size_t sVar2;
  pointer pdVar3;
  double local_30 [2];
  
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar1 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    local_30[0] = *pdVar3;
    local_30[1] = 0.0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<std::complex<double>>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)this,
               (complex<double> *)local_30);
  }
  removeHighOrderZeroCoefficients(this);
  sVar2 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar2;
  this->order_ = sVar2 - 1;
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::vector<T>& coefficients)
        {
            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }